

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Reader::readNumber(Reader *this)

{
  bool bVar1;
  long in_RDI;
  
  while ((*(long *)(in_RDI + 0xd0) != *(long *)(in_RDI + 200) &&
         ((('/' < **(char **)(in_RDI + 0xd0) && (**(char **)(in_RDI + 0xd0) < ':')) ||
          (bVar1 = in(**(Char **)(in_RDI + 0xd0),'.','e','E','+','-'), bVar1))))) {
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + 1;
  }
  return;
}

Assistant:

void Reader::readNumber() {
  while (current_ != end_) {
    if (!(*current_ >= '0' && *current_ <= '9') &&
        !in(*current_, '.', 'e', 'E', '+', '-'))
      break;
    ++current_;
  }
}